

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O3

void __thiscall dynamicgraph::PoolStorage::writeGraph(PoolStorage *this,string *aFileName)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  string GenericName;
  string tmp1;
  time_t ltime;
  tm ltimeformatted;
  ofstream GraphFile;
  char *local_2b0;
  long local_2a8;
  char local_2a0;
  undefined7 uStack_29f;
  long *local_290 [2];
  long local_280 [2];
  time_t local_270;
  tm local_268;
  long *local_230;
  filebuf local_228 [8];
  long local_220 [29];
  ios_base local_138 [264];
  
  std::__cxx11::string::rfind((char *)aFileName,0x125ba5,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_290,(ulong)aFileName);
  lVar2 = std::__cxx11::string::rfind((char *)aFileName,0x125ee2,0xffffffffffffffff);
  local_2b0 = &local_2a0;
  local_2a8 = 0;
  local_2a0 = '\0';
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)&local_2b0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_230,(ulong)local_290);
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_230);
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
  }
  local_270 = time((time_t *)0x0);
  localtime_r(&local_270,&local_268);
  std::ofstream::ofstream(&local_230,(aFileName->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"/* This graph has been automatically generated. ",0x30);
  std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"   ",3);
  poVar3 = (ostream *)std::ostream::operator<<(&local_230,local_268.tm_year + 0x76c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Month: ",8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268.tm_mon + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Day: ",6);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268.tm_mday);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Time: ",7);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268.tm_hour);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  std::ostream::operator<<(poVar3,local_268.tm_min);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," */",3);
  std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"digraph \"",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" { ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"\t graph [ label=\"",0x11);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" bgcolor = white rankdir=LR ]",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\t node [ fontcolor = black, color = black,",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"fillcolor = gold1, style=filled, shape=box ] ; ",0x2f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"\tsubgraph cluster_Entities { ",0x1d);
  std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t} ",3);
  std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  p_Var4 = (this->entityMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->entityMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      plVar1 = *(long **)(p_Var4 + 2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,(char *)plVar1[1],plVar1[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [ label = \"",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)plVar1[1],plVar1[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ,",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"   fontcolor = black, color = black, fillcolor=cyan,",0x34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," style=filled, shape=box ]",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (**(code **)(*plVar1 + 0x20))(plVar1,(ostream *)&local_230);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}",1);
  std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + _VTT[-3] + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,CONCAT71(uStack_29f,local_2a0) + 1);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  return;
}

Assistant:

void PoolStorage::writeGraph(const std::string &aFileName) {
  size_t IdxPointFound = aFileName.rfind(".");
  std::string tmp1 = aFileName.substr(0, IdxPointFound);
  size_t IdxSeparatorFound = aFileName.rfind("/");
  std::string GenericName;
  if (IdxSeparatorFound != std::string::npos)
    GenericName = tmp1.substr(IdxSeparatorFound, tmp1.length());
  else
    GenericName = tmp1;

  /* Reading local time */
  time_t ltime;
  ltime = time(NULL);
  struct tm ltimeformatted;
#ifdef WIN32
  localtime_s(&ltimeformatted, &ltime);
#else
  localtime_r(&ltime, &ltimeformatted);
#endif /*WIN32*/

  /* Opening the file and writing the first comment. */
  std::ofstream GraphFile(aFileName.c_str(), std::ofstream::out);
  GraphFile << "/* This graph has been automatically generated. " << std::endl;
  GraphFile << "   " << 1900 + ltimeformatted.tm_year
            << " Month: " << 1 + ltimeformatted.tm_mon
            << " Day: " << ltimeformatted.tm_mday
            << " Time: " << ltimeformatted.tm_hour << ":"
            << ltimeformatted.tm_min;
  GraphFile << " */" << std::endl;
  GraphFile << "digraph \"" << GenericName << "\" { ";
  GraphFile << "\t graph [ label=\"" << GenericName
            << "\" bgcolor = white rankdir=LR ]" << std::endl
            << "\t node [ fontcolor = black, color = black,"
            << "fillcolor = gold1, style=filled, shape=box ] ; " << std::endl;
  GraphFile << "\tsubgraph cluster_Entities { " << std::endl;

  GraphFile << "\t} " << std::endl;

  for (Entities::iterator iter = entityMap.begin(); iter != entityMap.end();
       ++iter) {
    Entity *ent = iter->second;
    GraphFile << "\"" << ent->getName() << "\""
              << " [ label = \"" << ent->getName() << "\" ," << std::endl
              << "   fontcolor = black, color = black, fillcolor=cyan,"
              << " style=filled, shape=box ]" << std::endl;
    ent->writeGraph(GraphFile);
  }

  GraphFile << "}" << std::endl;

  GraphFile.close();
}